

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O1

wpt_object wpt_init(wave_object wave,int siglength,int J)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  wpt_object pwVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  double dVar9;
  
  if (J < 0x65) {
    iVar1 = wave->filtlength;
    iVar2 = wmaxiter(siglength);
    if (J <= iVar2) {
      iVar7 = 0;
      iVar6 = 0;
      if (0 < J) {
        iVar4 = 1;
        iVar6 = 0;
        iVar3 = J;
        do {
          iVar6 = iVar6 + iVar4 * 2;
          iVar4 = iVar4 * 2;
          iVar3 = iVar3 + -1;
        } while (iVar3 != 0);
      }
      if (0 < J) {
        iVar8 = J + 1;
        iVar4 = siglength;
        iVar3 = 2;
        do {
          iVar7 = iVar3;
          dVar9 = ceil((double)(iVar4 + iVar1 + -2) * 0.5);
          iVar4 = (int)dVar9;
          iVar8 = iVar8 + -1;
          iVar3 = iVar7 * 2;
        } while (1 < iVar8);
        iVar7 = iVar7 * iVar4;
      }
      iVar4 = iVar7 + iVar6 * 4;
      iVar3 = iVar4 + J * 2 + 6;
      pwVar5 = (wpt_object)malloc((long)iVar3 * 8 + 0x220);
      pwVar5->outlength = (iVar1 + 1) * (J * 2 + 2) + siglength;
      builtin_strncpy(pwVar5->ext,"sym",4);
      builtin_strncpy(pwVar5->entropy,"shannon",8);
      pwVar5->eparam = 0.0;
      pwVar5->wave = wave;
      pwVar5->siglength = siglength;
      pwVar5->J = J;
      pwVar5->MaxIter = iVar2;
      pwVar5->even = ~siglength & 1;
      pwVar5->cobj = (conv_object)0x0;
      pwVar5->nodes = iVar6;
      pwVar5->lenlength = J + 2;
      pwVar5->output = (double *)(pwVar5 + 1);
      pwVar5->costvalues = (double *)(pwVar5[1].ext + (long)iVar7 * 8 + -0x28);
      pwVar5->basisvector = (double *)(pwVar5[1].ext + (long)(iVar6 + 1 + iVar7) * 8 + -0x28);
      pwVar5->nodeindex = (int *)(pwVar5[1].ext + (long)(iVar7 + 2 + iVar6 * 2) * 8 + -0x28);
      pwVar5->numnodeslevel = (int *)(pwVar5[1].ext + (long)iVar4 * 8 + -8);
      pwVar5->coeflength = (int *)(pwVar5[1].ext + (long)(J + 5 + iVar4) * 8 + -0x28);
      if (0 < iVar3) {
        memset(pwVar5 + 1,0,(ulong)(J * 2 + iVar7 + iVar6 * 4 + 5) * 8 + 8);
      }
      return pwVar5;
    }
    printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n");
  }
  else {
    puts("\n The Decomposition Iterations Cannot Exceed 100. Exiting ");
  }
  exit(-1);
}

Assistant:

wpt_object wpt_init(wave_object wave, int siglength, int J) {
	int size, i, MaxIter, temp, nodes,elength,p2,N,lp;
	wpt_object obj = NULL;

	size = wave->filtlength;

	if (J > 100) {
		printf("\n The Decomposition Iterations Cannot Exceed 100. Exiting \n");
		exit(-1);
	}


	MaxIter = wmaxiter(siglength);
	if (J > MaxIter) {
		printf("\n Error - The Signal Can only be iterated %d times using this wavelet. Exiting\n", MaxIter);
		exit(-1);
	}
	temp = 1;
	nodes = 0;
	for (i = 0; i < J; ++i) {
		temp *= 2;
		nodes += temp;
	}

	i = J;
	p2 = 2;
	N = siglength;
	lp = size;
	elength = 0;
	while (i > 0) {
		N = N + lp - 2;
		N = (int)ceil((double)N / 2.0);
		elength = p2 * N;
		i--;
		p2 *= 2;
	}
	//printf("elength %d", elength);

	obj = (wpt_object)malloc(sizeof(struct wpt_set) + sizeof(double)* (elength + 4 * nodes + 2 * J + 6));
	obj->outlength = siglength + 2 * (J + 1) * (size + 1);
	strcpy(obj->ext, "sym");
	strcpy(obj->entropy, "shannon");
	obj->eparam = 0.0;

	obj->wave = wave;
	obj->siglength = siglength;
	obj->J = J;
	obj->MaxIter = MaxIter;

	if (siglength % 2 == 0) {
		obj->even = 1;
	}
	else {
		obj->even = 0;
	}

	obj->cobj = NULL;
	obj->nodes = nodes;

	obj->lenlength = J + 2;
	obj->output = &obj->params[0];
	obj->costvalues = &obj->params[elength];
	obj->basisvector = &obj->params[elength + nodes + 1];
	obj->nodeindex = (int*)&obj->params[elength + 2*nodes + 2];
	obj->numnodeslevel = (int*)&obj->params[elength + 4 * nodes + 4];
	obj->coeflength = (int*)&obj->params[elength + 4 * nodes + J + 5];

	for (i = 0; i < elength + 4 * nodes + 2 * J + 6; ++i) {
		obj->params[i] = 0.0;
	}

	//wave_summary(obj->wave);

	return obj;
}